

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NwnStreams.h
# Opt level: O1

size_t __thiscall CNwnMemoryStream::Write(CNwnMemoryStream *this,void *pBuffer,size_t nCount)

{
  bool bVar1;
  uchar *puVar2;
  
  bVar1 = WriteMakeRoom(this,nCount);
  if (bVar1) {
    memcpy(this->m_pauchPos,pBuffer,nCount);
    puVar2 = this->m_pauchPos + nCount;
    this->m_pauchPos = puVar2;
    if (this->m_pauchEnd < puVar2) {
      this->m_pauchEnd = puVar2;
    }
  }
  else {
    nCount = 0;
  }
  return nCount;
}

Assistant:

virtual size_t Write (void *pBuffer, size_t nCount)
	{
		if(!WriteMakeRoom (nCount))
			return 0;
		memcpy (m_pauchPos, pBuffer, nCount);
		m_pauchPos += nCount;
		if (m_pauchPos > m_pauchEnd)
			m_pauchEnd = m_pauchPos;
		return nCount;
	}